

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

bool embree::avx::DiscMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar18;
  float fVar19;
  undefined1 auVar16 [16];
  float fVar20;
  undefined1 auVar17 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  float fVar37;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 local_1b8 [16];
  Scene *local_1a0;
  RayQueryContext *local_198;
  Primitive *local_190;
  RTCFilterFunctionNArguments args;
  undefined1 local_138 [16];
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  float local_f8 [4];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  RTCHitN local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined1 auVar48 [64];
  
  local_1a0 = context->scene;
  pGVar6 = (local_1a0->geometries).items[Disc->sharedGeomID].ptr;
  lVar7 = *(long *)&pGVar6->field_0x58;
  _Var8 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar13 = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[0] * _Var8);
  auVar38 = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[1] * _Var8);
  auVar33 = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[2] * _Var8);
  auVar25 = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[3] * _Var8);
  auVar14 = vunpcklps_avx(auVar13,auVar33);
  auVar17 = vunpckhps_avx(auVar13,auVar33);
  auVar13 = vunpcklps_avx(auVar38,auVar25);
  auVar39 = vunpckhps_avx(auVar38,auVar25);
  auVar25 = vunpcklps_avx(auVar14,auVar13);
  auVar38 = vunpckhps_avx(auVar14,auVar13);
  auVar34 = vunpcklps_avx(auVar17,auVar39);
  auVar13 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar33 = vpcmpgtd_avx(auVar13,_DAT_01f4ad30);
  local_138 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar25 = vsubps_avx(auVar25,auVar16);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar14 = vsubps_avx(auVar38,auVar14);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar34 = vsubps_avx(auVar34,auVar13);
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar13 = ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar38 = vshufps_avx(auVar13,auVar13,0);
  auVar13 = vrcpps_avx(auVar38);
  fVar37 = auVar13._0_4_;
  auVar30._0_4_ = fVar37 * auVar38._0_4_;
  fVar41 = auVar13._4_4_;
  auVar30._4_4_ = fVar41 * auVar38._4_4_;
  fVar42 = auVar13._8_4_;
  auVar30._8_4_ = fVar42 * auVar38._8_4_;
  fVar43 = auVar13._12_4_;
  auVar30._12_4_ = fVar43 * auVar38._12_4_;
  auVar44._8_4_ = 0x3f800000;
  auVar44._0_8_ = 0x3f8000003f800000;
  auVar44._12_4_ = 0x3f800000;
  auVar13 = vsubps_avx(auVar44,auVar30);
  fVar26 = auVar34._0_4_;
  fVar27 = auVar34._4_4_;
  fVar28 = auVar34._8_4_;
  fVar29 = auVar34._12_4_;
  fVar21 = auVar14._0_4_;
  fVar22 = auVar14._4_4_;
  fVar23 = auVar14._8_4_;
  fVar24 = auVar14._12_4_;
  fVar15 = auVar25._0_4_;
  fVar18 = auVar25._4_4_;
  fVar19 = auVar25._8_4_;
  fVar20 = auVar25._12_4_;
  local_108._0_4_ =
       (fVar15 * fVar2 + fVar21 * fVar3 + fVar26 * fVar4) * (fVar37 + fVar37 * auVar13._0_4_);
  local_108._4_4_ =
       (fVar18 * fVar2 + fVar22 * fVar3 + fVar27 * fVar4) * (fVar41 + fVar41 * auVar13._4_4_);
  local_108._8_4_ =
       (fVar19 * fVar2 + fVar23 * fVar3 + fVar28 * fVar4) * (fVar42 + fVar42 * auVar13._8_4_);
  local_108._12_4_ =
       (fVar20 * fVar2 + fVar24 * fVar3 + fVar29 * fVar4) * (fVar43 + fVar43 * auVar13._12_4_);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar13 = vcmpps_avx(auVar38,local_108,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar48 = ZEXT1664(auVar47);
  auVar38 = vcmpps_avx(local_108,auVar47,2);
  auVar13 = vandps_avx(auVar38,auVar13);
  auVar38 = auVar33 & auVar13;
  if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar38[0xf] < '\0') {
    auVar13 = vandps_avx(auVar13,auVar33);
    auVar17 = vunpckhps_avx(auVar17,auVar39);
    auVar33._0_4_ = fVar2 * local_108._0_4_;
    auVar33._4_4_ = fVar2 * local_108._4_4_;
    auVar33._8_4_ = fVar2 * local_108._8_4_;
    auVar33._12_4_ = fVar2 * local_108._12_4_;
    auVar39._0_4_ = fVar3 * local_108._0_4_;
    auVar39._4_4_ = fVar3 * local_108._4_4_;
    auVar39._8_4_ = fVar3 * local_108._8_4_;
    auVar39._12_4_ = fVar3 * local_108._12_4_;
    auVar45._0_4_ = fVar4 * local_108._0_4_;
    auVar45._4_4_ = fVar4 * local_108._4_4_;
    auVar45._8_4_ = fVar4 * local_108._8_4_;
    auVar45._12_4_ = fVar4 * local_108._12_4_;
    auVar38 = vsubps_avx(auVar25,auVar33);
    auVar33 = vsubps_avx(auVar14,auVar39);
    auVar25 = vsubps_avx(auVar34,auVar45);
    auVar34._0_4_ =
         auVar38._0_4_ * auVar38._0_4_ +
         auVar33._0_4_ * auVar33._0_4_ + auVar25._0_4_ * auVar25._0_4_;
    auVar34._4_4_ =
         auVar38._4_4_ * auVar38._4_4_ +
         auVar33._4_4_ * auVar33._4_4_ + auVar25._4_4_ * auVar25._4_4_;
    auVar34._8_4_ =
         auVar38._8_4_ * auVar38._8_4_ +
         auVar33._8_4_ * auVar33._8_4_ + auVar25._8_4_ * auVar25._8_4_;
    auVar34._12_4_ =
         auVar38._12_4_ * auVar38._12_4_ +
         auVar33._12_4_ * auVar33._12_4_ + auVar25._12_4_ * auVar25._12_4_;
    auVar25._0_4_ = auVar17._0_4_ * auVar17._0_4_;
    auVar25._4_4_ = auVar17._4_4_ * auVar17._4_4_;
    auVar25._8_4_ = auVar17._8_4_ * auVar17._8_4_;
    auVar25._12_4_ = auVar17._12_4_ * auVar17._12_4_;
    auVar38 = vcmpps_avx(auVar34,auVar25,2);
    auVar33 = auVar13 & auVar38;
    if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0')
    {
      auVar38 = vandps_avx(auVar38,auVar13);
      auVar17._0_4_ = fVar15 * fVar15 + fVar21 * fVar21 + fVar26 * fVar26;
      auVar17._4_4_ = fVar18 * fVar18 + fVar22 * fVar22 + fVar27 * fVar27;
      auVar17._8_4_ = fVar19 * fVar19 + fVar23 * fVar23 + fVar28 * fVar28;
      auVar17._12_4_ = fVar20 * fVar20 + fVar24 * fVar24 + fVar29 * fVar29;
      auVar33 = vcmpps_avx(auVar17,auVar25,6);
      auVar38 = vandps_avx(auVar38,auVar33);
      iVar11 = vmovmskps_avx(auVar38);
      if (iVar11 != 0) {
        local_e8._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
        local_e8._8_4_ = -fVar3;
        local_e8._12_4_ = -fVar3;
        local_d8._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
        local_d8._8_4_ = -fVar4;
        local_d8._12_4_ = -fVar4;
        local_128 = ZEXT1632(ZEXT816(0));
        local_f8[0] = -fVar2;
        local_f8[1] = -fVar2;
        local_f8[2] = -fVar2;
        local_f8[3] = -fVar2;
        uVar12 = (ulong)(byte)iVar11;
        auVar31 = vcmpps_avx(ZEXT1632(local_108),ZEXT1632(local_108),0xf);
        auVar32 = ZEXT3264(auVar31);
        auVar35 = ZEXT864(0) << 0x20;
        auVar13 = vpcmpeqd_avx(auVar13,auVar13);
        auVar36 = ZEXT1664(auVar13);
        auVar40 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
        auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
        local_190 = Disc;
        local_198 = context;
        do {
          args.hit = local_c8;
          uVar10 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar5 = *(uint *)(local_138 + uVar10 * 4);
          pGVar6 = (local_1a0->geometries).items[uVar5].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            if ((local_198->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              return true;
            }
            uVar1 = *(undefined4 *)(local_128 + uVar10 * 4);
            local_98._4_4_ = uVar1;
            local_98._0_4_ = uVar1;
            local_98._8_4_ = uVar1;
            local_98._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_128 + uVar10 * 4 + 0x10);
            local_88._4_4_ = uVar1;
            local_88._0_4_ = uVar1;
            local_88._8_4_ = uVar1;
            local_88._12_4_ = uVar1;
            *(float *)(ray + k * 4 + 0x80) = local_f8[uVar10 - 4];
            args.context = local_198->user;
            local_68 = vpshufd_avx(ZEXT416(uVar5),0);
            uVar5 = (local_190->primIDs).field_0.i[uVar10];
            local_78._4_4_ = uVar5;
            local_78._0_4_ = uVar5;
            local_78._8_4_ = uVar5;
            local_78._12_4_ = uVar5;
            fVar2 = local_f8[uVar10];
            uVar1 = *(undefined4 *)(local_e8 + uVar10 * 4);
            local_b8._4_4_ = uVar1;
            local_b8._0_4_ = uVar1;
            local_b8._8_4_ = uVar1;
            local_b8._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_d8 + uVar10 * 4);
            local_a8._4_4_ = uVar1;
            local_a8._0_4_ = uVar1;
            local_a8._8_4_ = uVar1;
            local_a8._12_4_ = uVar1;
            local_c8[0] = (RTCHitN)SUB41(fVar2,0);
            local_c8[1] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_c8[2] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_c8[3] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_c8[4] = (RTCHitN)SUB41(fVar2,0);
            local_c8[5] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_c8[6] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_c8[7] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_c8[8] = (RTCHitN)SUB41(fVar2,0);
            local_c8[9] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_c8[10] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_c8[0xb] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_c8[0xc] = (RTCHitN)SUB41(fVar2,0);
            local_c8[0xd] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_c8[0xe] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_c8[0xf] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            uStack_54 = (args.context)->instID[0];
            local_58 = uStack_54;
            uStack_50 = uStack_54;
            uStack_4c = uStack_54;
            uStack_48 = (args.context)->instPrimID[0];
            uStack_44 = uStack_48;
            uStack_40 = uStack_48;
            uStack_3c = uStack_48;
            local_1b8 = *(undefined1 (*) [16])
                         (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            args.geometryUserPtr = pGVar6->userPtr;
            args.N = 4;
            auVar38 = auVar48._0_16_;
            auVar13 = auVar40._0_16_;
            args.valid = (int *)local_1b8;
            args.ray = (RTCRayN *)ray;
            if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar31 = ZEXT1632(auVar32._0_16_);
              auVar33 = auVar36._0_16_;
              args.valid = (int *)local_1b8;
              (*pGVar6->occlusionFilterN)(&args);
              auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar40 = ZEXT1664(auVar13);
              auVar33 = vpcmpeqd_avx(auVar33,auVar33);
              auVar36 = ZEXT1664(auVar33);
              auVar35 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar31 = vcmpps_avx(auVar31,auVar31,0xf);
              auVar32 = ZEXT3264(auVar31);
              auVar48 = ZEXT1664(auVar38);
            }
            auVar33 = auVar36._0_16_;
            if (local_1b8 == (undefined1  [16])0x0) {
              auVar13 = vpcmpeqd_avx(auVar35._0_16_,(undefined1  [16])0x0);
              auVar33 = auVar33 ^ auVar13;
            }
            else {
              p_Var9 = local_198->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((local_198->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                auVar31 = ZEXT1632(auVar32._0_16_);
                (*p_Var9)(&args);
                auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar40 = ZEXT1664(auVar13);
                auVar13 = vpcmpeqd_avx(auVar33,auVar33);
                auVar36 = ZEXT1664(auVar13);
                auVar35 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar31 = vcmpps_avx(auVar31,auVar31,0xf);
                auVar32 = ZEXT3264(auVar31);
                auVar48 = ZEXT1664(auVar38);
              }
              auVar13 = vpcmpeqd_avx(auVar35._0_16_,local_1b8);
              auVar33 = auVar36._0_16_ ^ auVar13;
              auVar13 = vblendvps_avx(auVar46._0_16_,*(undefined1 (*) [16])(args.ray + 0x80),auVar13
                                     );
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar13;
            }
            if ((auVar40._0_16_ & auVar33) != (undefined1  [16])0x0) {
              return true;
            }
            *(int *)(ray + k * 4 + 0x80) = auVar48._0_4_;
          }
          uVar12 = uVar12 ^ 1L << (uVar10 & 0x3f);
        } while (uVar12 != 0);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }